

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fftnd.c
# Opt level: O2

void kiss_fftnd(kiss_fftnd_cfg st,kiss_fft_cpx *fin,kiss_fft_cpx *fout)

{
  int iVar1;
  uint in_stride;
  long lVar2;
  kiss_fft_cpx *pkVar3;
  ulong uVar4;
  bool bVar5;
  kiss_fft_cpx *local_48;
  
  local_48 = fout;
  if ((st->ndims & 1) == 0) {
    local_48 = st->tmpbuf;
  }
  else if (fin == fout) {
    memcpy(st->tmpbuf,fin,(long)st->dimprod << 3);
    fin = st->tmpbuf;
  }
  for (lVar2 = 0; lVar2 < st->ndims; lVar2 = lVar2 + 1) {
    iVar1 = st->dims[lVar2];
    in_stride = st->dimprod / iVar1;
    uVar4 = (ulong)(~((int)in_stride >> 0x1f) & in_stride);
    pkVar3 = local_48;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      kiss_fft_stride(st->states[lVar2],fin,pkVar3,in_stride);
      fin = fin + 1;
      pkVar3 = pkVar3 + iVar1;
    }
    pkVar3 = st->tmpbuf;
    bVar5 = local_48 == pkVar3;
    local_48 = pkVar3;
    fin = fout;
    if (bVar5) {
      local_48 = fout;
      fin = pkVar3;
    }
  }
  return;
}

Assistant:

void kiss_fftnd(kiss_fftnd_cfg st,const kiss_fft_cpx *fin,kiss_fft_cpx *fout)
{
    int i,k;
    const kiss_fft_cpx * bufin=fin;
    kiss_fft_cpx * bufout;

    /*arrange it so the last bufout == fout*/
    if ( st->ndims & 1 ) {
        bufout = fout;
        if (fin==fout) {
            memcpy( st->tmpbuf, fin, sizeof(kiss_fft_cpx) * st->dimprod );
            bufin = st->tmpbuf;
        }
    }else
        bufout = st->tmpbuf;

    for ( k=0; k < st->ndims; ++k) {
        int curdim = st->dims[k];
        int stride = st->dimprod / curdim;

        for ( i=0 ; i<stride ; ++i ) 
            kiss_fft_stride( st->states[k], bufin+i , bufout+i*curdim, stride );

        /*toggle back and forth between the two buffers*/
        if (bufout == st->tmpbuf){
            bufout = fout;
            bufin = st->tmpbuf;
        }else{
            bufout = st->tmpbuf;
            bufin = fout;
        }
    }
}